

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDependsFortran.cxx
# Opt level: O0

void __thiscall cmDependsFortran::LocateModules(cmDependsFortran *this)

{
  cmDependsFortranInternals *pcVar1;
  pointer this_00;
  bool bVar2;
  pointer ppVar3;
  iterator __first;
  reference __k;
  mapped_type *this_01;
  char *pcVar4;
  reference filename;
  long local_338;
  ifstream fin;
  undefined1 local_130 [8];
  string fname;
  string targetDir;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_e8;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_e0;
  const_iterator i_1;
  string local_d0;
  allocator local_99;
  string local_98;
  char *local_78;
  char *infoFilesValue;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  infoFiles;
  cmMakefile *mf;
  _Self local_48;
  const_iterator i;
  cmDependsFortranSourceInfo *info;
  _Self local_20;
  const_iterator infoI;
  ObjectInfoMap *objInfo;
  cmDependsFortran *this_local;
  
  infoI._M_node = (_Base_ptr)&this->Internal->ObjectInfo;
  local_20._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDependsFortranSourceInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDependsFortranSourceInfo>_>_>
       ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDependsFortranSourceInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDependsFortranSourceInfo>_>_>
                *)infoI._M_node);
  while( true ) {
    info = (cmDependsFortranSourceInfo *)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDependsFortranSourceInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDependsFortranSourceInfo>_>_>
           ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDependsFortranSourceInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDependsFortranSourceInfo>_>_>
                  *)infoI._M_node);
    bVar2 = std::operator!=(&local_20,(_Self *)&info);
    if (!bVar2) break;
    ppVar3 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDependsFortranSourceInfo>_>
             ::operator->(&local_20);
    pcVar1 = this->Internal;
    __first = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::begin(&(ppVar3->second).Provides);
    i._M_node = (_Base_ptr)
                std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::end(&(ppVar3->second).Provides);
    std::
    set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>::
    insert<std::_Rb_tree_const_iterator<std::__cxx11::string>>
              ((set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)pcVar1,
               (_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )__first._M_node,
               (_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )i._M_node);
    local_48._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin(&(ppVar3->second).Requires);
    while( true ) {
      mf = (cmMakefile *)
           std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(&(ppVar3->second).Requires);
      bVar2 = std::operator!=(&local_48,(_Self *)&mf);
      if (!bVar2) break;
      pcVar1 = this->Internal;
      __k = std::
            _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator*(&local_48);
      this_01 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](&pcVar1->TargetRequires,__k);
      std::__cxx11::string::operator=((string *)this_01,"");
      std::
      _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&local_48);
    }
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDependsFortranSourceInfo>_>
    ::operator++(&local_20);
  }
  bVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::empty(&this->Internal->TargetRequires);
  if (!bVar2) {
    MatchLocalModules(this);
    infoFiles.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)cmLocalGenerator::GetMakefile((this->super_cmDepends).LocalGenerator);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&infoFilesValue);
    this_00 = infoFiles.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_98,"CMAKE_TARGET_LINKED_INFO_FILES",&local_99);
    pcVar4 = cmMakefile::GetDefinition((cmMakefile *)this_00,&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    std::allocator<char>::~allocator((allocator<char> *)&local_99);
    local_78 = pcVar4;
    if (pcVar4 != (char *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_d0,pcVar4,(allocator *)((long)&i_1._M_current + 7));
      cmSystemTools::ExpandListArgument
                (&local_d0,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&infoFilesValue,false);
      std::__cxx11::string::~string((string *)&local_d0);
      std::allocator<char>::~allocator((allocator<char> *)((long)&i_1._M_current + 7));
    }
    local_e8._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&infoFilesValue);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                *)&local_e0,&local_e8);
    while( true ) {
      targetDir.field_2._8_8_ =
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&infoFilesValue);
      bVar2 = __gnu_cxx::operator!=
                        (&local_e0,
                         (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)((long)&targetDir.field_2 + 8));
      if (!bVar2) break;
      filename = __gnu_cxx::
                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&local_e0);
      cmsys::SystemTools::GetFilenamePath((string *)((long)&fname.field_2 + 8),filename);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_130,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&fname.field_2 + 8),"/fortran.internal");
      pcVar4 = (char *)std::__cxx11::string::c_str();
      std::ifstream::ifstream(&local_338,pcVar4,_S_in);
      bVar2 = std::ios::operator_cast_to_bool
                        ((ios *)((long)&local_338 + *(long *)(local_338 + -0x18)));
      if (bVar2) {
        pcVar4 = (char *)std::__cxx11::string::c_str();
        MatchRemoteModules(this,(istream *)&local_338,pcVar4);
      }
      std::ifstream::~ifstream(&local_338);
      std::__cxx11::string::~string((string *)local_130);
      std::__cxx11::string::~string((string *)(fname.field_2._M_local_buf + 8));
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_e0);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&infoFilesValue);
  }
  return;
}

Assistant:

void cmDependsFortran::LocateModules()
{
  // Collect the set of modules provided and required by all sources.
  typedef cmDependsFortranInternals::ObjectInfoMap ObjectInfoMap;
  ObjectInfoMap const& objInfo = this->Internal->ObjectInfo;
  for(ObjectInfoMap::const_iterator infoI = objInfo.begin();
      infoI != objInfo.end(); ++infoI)
    {
    cmDependsFortranSourceInfo const& info = infoI->second;
    // Include this module in the set provided by this target.
    this->Internal->TargetProvides.insert(info.Provides.begin(),
                                          info.Provides.end());

    for(std::set<std::string>::const_iterator i = info.Requires.begin();
        i != info.Requires.end(); ++i)
      {
      this->Internal->TargetRequires[*i] = "";
      }
    }

  // Short-circuit for simple targets.
  if(this->Internal->TargetRequires.empty())
    {
    return;
    }

  // Match modules provided by this target to those it requires.
  this->MatchLocalModules();

  // Load information about other targets.
  cmMakefile* mf = this->LocalGenerator->GetMakefile();
  std::vector<std::string> infoFiles;
  if(const char* infoFilesValue =
     mf->GetDefinition("CMAKE_TARGET_LINKED_INFO_FILES"))
    {
    cmSystemTools::ExpandListArgument(infoFilesValue, infoFiles);
    }
  for(std::vector<std::string>::const_iterator i = infoFiles.begin();
      i != infoFiles.end(); ++i)
    {
    std::string targetDir = cmSystemTools::GetFilenamePath(*i);
    std::string fname = targetDir + "/fortran.internal";
    cmsys::ifstream fin(fname.c_str());
    if(fin)
      {
      this->MatchRemoteModules(fin, targetDir.c_str());
      }
    }
}